

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string_view name,Symbol symbol)

{
  basic_string_view<char,_std::char_traits<char>_> *v1;
  basic_string_view<char,_std::char_traits<char>_> *v2;
  LogMessage *pLVar1;
  void **v1_00;
  void **v2_00;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>::iterator,_bool>
  local_e8;
  undefined1 local_d0 [16];
  LogMessageFatal local_c0 [23];
  Voidify local_a9;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_a8;
  string *local_90;
  string *absl_log_internal_check_op_result_1;
  undefined1 local_78 [16];
  LogMessageFatal local_68 [23];
  Voidify local_51;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_50;
  string *local_38;
  string *absl_log_internal_check_op_result;
  void *parent_local;
  FileDescriptorTables *this_local;
  Symbol symbol_local;
  string_view name_local;
  
  symbol_local.ptr_ = (SymbolBase *)name._M_len;
  absl_log_internal_check_op_result = (string *)parent;
  parent_local = this;
  this_local = (FileDescriptorTables *)symbol.ptr_;
  v1 = absl::lts_20240722::log_internal::
       GetReferenceableValue<std::basic_string_view<char,std::char_traits<char>>>
                 ((basic_string_view<char,_std::char_traits<char>_> *)&symbol_local);
  Symbol::parent_name_key(&local_50,(Symbol *)&this_local);
  v2 = absl::lts_20240722::log_internal::
       GetReferenceableValue<std::basic_string_view<char,std::char_traits<char>>>(&local_50.second);
  local_38 = absl::lts_20240722::log_internal::
             Check_EQImpl<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                       (v1,v2,"name == symbol.parent_name_key().second");
  if (local_38 != (string *)0x0) {
    local_78 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
               ,0x796,local_78._0_8_,local_78._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_68);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_51,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_68);
  }
  v1_00 = absl::lts_20240722::log_internal::GetReferenceableValue<void_const*>
                    (&absl_log_internal_check_op_result);
  Symbol::parent_name_key(&local_a8,(Symbol *)&this_local);
  v2_00 = absl::lts_20240722::log_internal::GetReferenceableValue<void_const*>(&local_a8.first);
  local_90 = absl::lts_20240722::log_internal::Check_EQImpl<void_const*,void_const*>
                       (v1_00,v2_00,"parent == symbol.parent_name_key().first");
  if (local_90 != (string *)0x0) {
    local_d0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
               ,0x797,local_d0._0_8_,local_d0._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_c0);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_a9,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_c0);
  }
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  ::insert<google::protobuf::Symbol,_0,_0>
            (&local_e8,
             (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              *)this,(Symbol *)&this_local);
  return (bool)(local_e8.second & 1);
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               absl::string_view name,
                                               Symbol symbol) {
  ABSL_DCHECK_EQ(name, symbol.parent_name_key().second);
  ABSL_DCHECK_EQ(parent, symbol.parent_name_key().first);
  return symbols_by_parent_.insert(symbol).second;
}